

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QNetworkRequestFactory::setTransferTimeout(QNetworkRequestFactory *this,milliseconds timeout)

{
  if ((((this->d).d.ptr)->transferTimeout).__r != timeout.__r) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(&this->d);
    (((this->d).d.ptr)->transferTimeout).__r = timeout.__r;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }